

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_codepoint<2ul,char,fmt::v10::appender>
                   (appender out,char prefix,uint32_t cp)

{
  char buf [2];
  char local_1a [2];
  
  local_1a[1] = 0x5c;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,local_1a + 1)
  ;
  local_1a[0] = prefix;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,local_1a);
  buf[0] = '0';
  buf[1] = '0';
  format_uint<4u,char,unsigned_int>(buf,cp,2,false);
  buffer<char>::append<char>
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,buf,local_1a)
  ;
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}